

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,double *output)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  if (0 < num_symbols) {
    uVar1 = 0;
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar3 = uVar3 + population_counts[uVar1];
      uVar2 = (uVar2 + 1) - (uint)(population_counts[uVar1] == 0);
      uVar1 = uVar1 + 1;
    } while ((uint)num_symbols != uVar1);
    if (1 < uVar2) {
      if (uVar3 < 0x100) {
        fVar4 = kLog2Table[uVar3];
      }
      else {
        fVar4 = (*VP8LFastLog2Slow)(uVar3);
      }
      if (0 < num_symbols) {
        uVar1 = 0;
        do {
          uVar2 = population_counts[uVar1];
          if ((ulong)uVar2 < 0x100) {
            fVar5 = kLog2Table[uVar2];
          }
          else {
            fVar5 = (*VP8LFastLog2Slow)(uVar2);
          }
          output[uVar1] = (double)fVar4 - (double)fVar5;
          uVar1 = uVar1 + 1;
        } while ((uint)num_symbols != uVar1);
      }
      return;
    }
  }
  memset(output,0,(long)num_symbols << 3);
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], double output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const double logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}